

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

_Bool isKnownKeyValue(char *key)

{
  _Bool _Var1;
  int iVar2;
  _Bool _Var3;
  
  _Var1 = isKnownKeyValueUINT32(key);
  _Var3 = true;
  if (!_Var1) {
    _Var1 = isKnownKeyValueString(key);
    if (!_Var1) {
      iVar2 = strcmp(key,"KTXglFormat");
      if (iVar2 != 0) {
        iVar2 = strcmp(key,"KTXanimData");
        if (iVar2 != 0) {
          iVar2 = strcmp(key,"KTXcubemapIncomplete");
          _Var3 = iVar2 == 0;
        }
      }
    }
  }
  return _Var3;
}

Assistant:

bool isKnownKeyValue(const char* key) {
    if (isKnownKeyValueUINT32(key))
        return true;
    if (isKnownKeyValueString(key))
        return true;
    if (strcmp(key, "KTXglFormat") == 0)
        return true;
    if (strcmp(key, "KTXanimData") == 0)
        return true;
    if (strcmp(key, "KTXcubemapIncomplete") == 0)
        return true;
    return false;
}